

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBegin_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  size_t sVar1;
  undefined1 local_b8 [8];
  ZSTD_CCtx_params cctxParams;
  unsigned_long_long pledgedSrcSize_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CCtx *cctx_local;
  
  cctxParams.customMem.opaque = (void *)pledgedSrcSize;
  ZSTD_assignParamsToCCtxParams((ZSTD_CCtx_params *)local_b8,&cctx->requestedParams,&params);
  sVar1 = ZSTD_compressBegin_advanced_internal
                    (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,
                     (ZSTD_CCtx_params *)local_b8,(unsigned_long_long)cctxParams.customMem.opaque);
  return sVar1;
}

Assistant:

size_t ZSTD_compressBegin_advanced(ZSTD_CCtx* cctx,
                             const void* dict, size_t dictSize,
                                   ZSTD_parameters params, unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params const cctxParams =
            ZSTD_assignParamsToCCtxParams(&cctx->requestedParams, &params);
    return ZSTD_compressBegin_advanced_internal(cctx,
                                            dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                            NULL /*cdict*/,
                                            &cctxParams, pledgedSrcSize);
}